

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhosttx.cpp
# Opt level: O0

void __thiscall CVmHostIfcText::~CVmHostIfcText(CVmHostIfcText *this)

{
  CVmHostIfc *in_RDI;
  size_t i;
  CVmHashTable *in_stack_fffffffffffffff0;
  _func_int **pp_Var1;
  
  in_RDI->_vptr_CVmHostIfc = (_func_int **)&PTR__CVmHostIfcText_00445808;
  pp_Var1 = in_RDI[1]._vptr_CVmHostIfc;
  if (pp_Var1 != (_func_int **)0x0) {
    CVmHashTable::~CVmHashTable(in_stack_fffffffffffffff0);
    operator_delete(pp_Var1,0x20);
  }
  for (pp_Var1 = (_func_int **)0x0; pp_Var1 < in_RDI[3]._vptr_CVmHostIfc;
      pp_Var1 = (_func_int **)((long)pp_Var1 + 1)) {
    lib_free_str((char *)0x35ce99);
  }
  free(in_RDI[2]._vptr_CVmHostIfc);
  lib_free_str((char *)0x35cec9);
  CVmHostIfc::~CVmHostIfc(in_RDI);
  return;
}

Assistant:

CVmHostIfcText::~CVmHostIfcText()
{
    /* delete our hash table */
    delete restab_;

    /* delete our external filenames */
    for (size_t i = 0 ; i < ext_cnt_ ; ++i)
        lib_free_str(ext_[i]);

    /* delete our array of external filename entries */
    t3free(ext_);

    /* delete our resource directory path */
    lib_free_str(res_dir_);
}